

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

QMetaMethod __thiscall
QMetaObjectPrivate::firstMethod
          (QMetaObjectPrivate *this,QMetaObject *baseObject,QByteArrayView name)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  QMetaObject *currentObject;
  Data DVar4;
  int iVar5;
  long in_FS_OFFSET;
  QMetaMethod QVar6;
  QArrayDataPointer<char> local_80;
  QByteArrayView local_68;
  QByteArrayView local_58;
  QMetaMethod local_48;
  long local_38;
  
  local_58.m_data = (storage_type *)name.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.m_size = (qsizetype)baseObject;
  for (; this != (QMetaObjectPrivate *)0x0; this = *(QMetaObjectPrivate **)this) {
    iVar1 = *(int *)(*(long *)&this->methodCount + 0x10);
    iVar5 = iVar1 + 1;
    uVar3 = iVar1 * 6;
    while( true ) {
      uVar3 = uVar3 - 6;
      iVar5 = iVar5 + -1;
      if (iVar5 < 1) break;
      DVar4.d = (uint *)(*(long *)&this->methodCount +
                         (long)*(int *)(*(long *)&this->methodCount + 0x14) * 4 + (ulong)uVar3 * 4);
      local_48.mobj = (QMetaObject *)this;
      local_48.data.d = DVar4.d;
      QMetaMethod::name((QByteArray *)&local_80,&local_48);
      local_68.m_size = local_80.size;
      local_68.m_data = local_80.ptr;
      bVar2 = ::comparesEqual(&local_58,&local_68);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
      if (bVar2) goto LAB_0025f73a;
    }
  }
  DVar4.d = (uint *)0x0;
LAB_0025f73a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar6.data.d = DVar4.d;
  QVar6.mobj = (QMetaObject *)this;
  return QVar6;
}

Assistant:

QMetaMethod QMetaObjectPrivate::firstMethod(const QMetaObject *baseObject, QByteArrayView name)
{
    for (const QMetaObject *currentObject = baseObject; currentObject; currentObject = currentObject->superClass()) {
        const int start = priv(currentObject->d.data)->methodCount - 1;
        const int end = 0;
        for (int i = start; i >= end; --i) {
            auto candidate = QMetaMethod::fromRelativeMethodIndex(currentObject, i);
            if (name == candidate.name())
                return candidate;
        }
    }
    return QMetaMethod{};
}